

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O3

uint64_t helper_psubh_mips(uint64_t fs,uint64_t ft)

{
  return CONCAT26((short)(fs >> 0x30) - (short)(ft >> 0x30),
                  CONCAT24((short)(fs >> 0x20) - (short)(ft >> 0x20),
                           CONCAT22((short)(fs >> 0x10) - (short)(ft >> 0x10),(short)fs - (short)ft)
                          ));
}

Assistant:

uint64_t helper_psubh(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned int i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 4; ++i) {
        vs.uh[i] -= vt.uh[i];
    }
    return vs.d;
}